

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationTest.cpp
# Opt level: O1

void __thiscall TestDefaultConfiguration::Run(TestDefaultConfiguration *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  const_iterator cVar3;
  runtime_error *prVar4;
  Configuration config;
  key_type local_238;
  Configuration local_218;
  
  Configuration::Configuration(&local_218);
  iVar2 = std::__cxx11::string::compare((char *)&local_218);
  if (iVar2 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.companyName == \"YourCompany\"");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_218.regenTag);
  if (iVar2 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.regenTag == \"GENERATED BY CPP-DEPENDENCIES\"");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_218.versionUsed);
  if (iVar2 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.versionUsed == CURRENT_VERSION");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_218.cycleColor);
  if (iVar2 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Assertion failed: config.cycleColor == \"orange\"");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_218.publicDepColor);
  if (iVar2 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Assertion failed: config.publicDepColor == \"blue\"");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_218.privateDepColor);
  if (iVar2 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.privateDepColor == \"lightblue\"");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_218.componentLinkLimit != 0x1e) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Assertion failed: config.componentLinkLimit == 30");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_218.componentLocLowerLimit == 200) {
    if (local_218.componentLocUpperLimit != 20000) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,"Assertion failed: config.componentLocUpperLimit == 20000");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_218.fileLocUpperLimit != 2000) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Assertion failed: config.fileLocUpperLimit == 2000")
      ;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_218.addLibraryAliases._M_h._M_element_count != 1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,"Assertion failed: config.addLibraryAliases.size() == 1");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar1 = &local_238.field_2;
    local_238._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"add_library","");
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&local_218.addLibraryAliases._M_h,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != paVar1) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (cVar3.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      if (local_218.addExecutableAliases._M_h._M_element_count != 1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar4,"Assertion failed: config.addExecutableAliases.size() == 1");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_238._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"add_executable","");
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&local_218.addExecutableAliases._M_h,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar1) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (cVar3.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        Configuration::~Configuration(&local_218);
        return;
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,
                 "Assertion failed: config.addExecutableAliases.count(\"add_executable\") == 1");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Assertion failed: config.addLibraryAliases.count(\"add_library\") == 1");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Assertion failed: config.componentLocLowerLimit == 200")
  ;
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(DefaultConfiguration)
{
  Configuration config;
  ASSERT(config.companyName == "YourCompany");
  ASSERT(config.regenTag == "GENERATED BY CPP-DEPENDENCIES");
  ASSERT(config.versionUsed == CURRENT_VERSION);
  ASSERT(config.cycleColor == "orange");
  ASSERT(config.publicDepColor == "blue");
  ASSERT(config.privateDepColor == "lightblue");
  ASSERT(config.componentLinkLimit == 30);
  ASSERT(config.componentLocLowerLimit == 200);
  ASSERT(config.componentLocUpperLimit == 20000);
  ASSERT(config.fileLocUpperLimit == 2000);
  ASSERT(config.addLibraryAliases.size() == 1);
  ASSERT(config.addLibraryAliases.count("add_library") == 1);
  ASSERT(config.addExecutableAliases.size() == 1);
  ASSERT(config.addExecutableAliases.count("add_executable") == 1);
}